

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::rehash
          (Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *this,size_t sizeHint)

{
  ulong uVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  Node *this_00;
  ulong uVar5;
  size_t index;
  long lVar6;
  Span *pSVar7;
  size_t numBuckets;
  long lVar8;
  long in_FS_OFFSET;
  R RVar9;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if (0x40 < sizeHint) {
    if (sizeHint >> 0x3e == 0) {
      lVar6 = 0x3f;
      if (sizeHint != 0) {
        for (; sizeHint >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar6 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar9 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar9.spans;
  this->numBuckets = numBuckets;
  pSVar7 = pSVar2;
  for (uVar5 = 0; uVar5 != uVar1 >> 7; uVar5 = uVar5 + 1) {
    for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 1) {
      uVar4 = (ulong)pSVar7->offsets[lVar6];
      if (uVar4 != 0xff) {
        pEVar3 = pSVar2[uVar5].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = findBucket<QPixmapCache::Key>(this,(Key *)(pEVar3[uVar4].storage.data + 0x10));
        this_00 = Bucket::insert(&local_48);
        QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node::Node(this_00,(Node *)(pEVar3 + uVar4));
      }
    }
    Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::freeData(pSVar2 + uVar5);
    pSVar7 = pSVar7 + 1;
  }
  if (pSVar2 != (Span *)0x0) {
    lVar6 = *(long *)&pSVar2[-1].allocated;
    if (lVar6 != 0) {
      lVar8 = lVar6 * 0x90;
      do {
        Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::freeData
                  ((Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *)
                   (pSVar2[-1].offsets + lVar8));
        lVar8 = lVar8 + -0x90;
      } while (lVar8 != 0);
    }
    operator_delete__(&pSVar2[-1].allocated,lVar6 * 0x90 | 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }